

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

MemoryAccessMask __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::TranslateMemoryAccess
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  bool bVar1;
  MemoryAccessMask a;
  MemoryAccessMask local_24;
  MemoryAccessMask mask;
  CoherentFlags *coherentFlags_local;
  TGlslangToSpvTraverser *this_local;
  
  local_24 = MaskNone;
  bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  if ((bVar1) && ((*(ushort *)coherentFlags >> 9 & 1) == 0)) {
    bVar1 = spv::Builder::AccessChain::CoherentFlags::isVolatile(coherentFlags);
    if ((bVar1) ||
       (bVar1 = spv::Builder::AccessChain::CoherentFlags::anyCoherent(coherentFlags), bVar1)) {
      a = spv::operator|(MaskNone,MakePointerAvailable);
      local_24 = spv::operator|(a,MakePointerVisible);
    }
    if ((*(ushort *)coherentFlags >> 6 & 1) != 0) {
      local_24 = spv::operator|(local_24,MemoryAccessNonPrivatePointerKHRMask);
    }
    if ((*(ushort *)coherentFlags >> 7 & 1) != 0) {
      local_24 = spv::operator|(local_24,MemoryAccessVolatileMask);
    }
    if ((*(ushort *)coherentFlags >> 8 & 1) != 0) {
      local_24 = spv::operator|(local_24,MemoryAccessNontemporalMask);
    }
    if (local_24 != MaskNone) {
      spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
    }
    this_local._4_4_ = local_24;
  }
  else {
    this_local._4_4_ = MaskNone;
  }
  return this_local._4_4_;
}

Assistant:

spv::MemoryAccessMask TGlslangToSpvTraverser::TranslateMemoryAccess(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::MemoryAccessMask mask = spv::MemoryAccessMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel() || coherentFlags.isImage)
        return mask;

    if (coherentFlags.isVolatile() || coherentFlags.anyCoherent()) {
        mask = mask | spv::MemoryAccessMakePointerAvailableKHRMask |
                      spv::MemoryAccessMakePointerVisibleKHRMask;
    }

    if (coherentFlags.nonprivate) {
        mask = mask | spv::MemoryAccessNonPrivatePointerKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::MemoryAccessVolatileMask;
    }
    if (coherentFlags.nontemporal) {
        mask = mask | spv::MemoryAccessNontemporalMask;
    }
    if (mask != spv::MemoryAccessMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}